

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O3

pair<const_unsigned_short_*,_const_unsigned_short_*> __thiscall
frozen::
unordered_set<unsigned_short,_3UL,_frozen::elsa<unsigned_short>,_std::equal_to<unsigned_short>_>::
equal_range<int>(unordered_set<unsigned_short,_3UL,_frozen::elsa<unsigned_short>,_std::equal_to<unsigned_short>_>
                 *this,int *key)

{
  undefined1 *puVar1;
  size_t sVar2;
  unsigned_short *puVar3;
  unsigned_short *puVar4;
  bool bVar5;
  pair<const_unsigned_short_*,_const_unsigned_short_*> pVar6;
  
  sVar2 = bits::pmh_tables<8ul,frozen::elsa<unsigned_short>>::
          lookup<int,frozen::elsa<unsigned_short>>
                    ((pmh_tables<8ul,frozen::elsa<unsigned_short>> *)&this->tables_,key,
                     (elsa<unsigned_short> *)&this->tables_);
  puVar1 = &this->field_0x6;
  puVar3 = (unsigned_short *)puVar1;
  puVar4 = (unsigned_short *)puVar1;
  if (sVar2 != 3) {
    bVar5 = (this->keys_).data_[sVar2] != (unsigned_short)*key;
    puVar3 = (this->keys_).data_ + sVar2;
    if (bVar5) {
      puVar3 = (unsigned_short *)puVar1;
    }
    puVar4 = (this->keys_).data_ + sVar2 + 1;
    if (bVar5) {
      puVar4 = (unsigned_short *)puVar1;
    }
  }
  pVar6.second = puVar4;
  pVar6.first = puVar3;
  return pVar6;
}

Assistant:

constexpr std::pair<const_iterator, const_iterator> equal_range(KeyType const &key) const {
    auto const it = find(key);
    if (it != end())
      return {it, it + 1};
    else
      return {keys_.end(), keys_.end()};
  }